

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

void __thiscall FCELTexture::MakeTexture(FCELTexture *this)

{
  BYTE *src;
  BYTE BVar1;
  BYTE *pBVar2;
  long lVar3;
  BYTE *oldPixels;
  BYTE *color;
  size_t i;
  BYTE palette [256];
  CELPalette celPalette;
  FCELTexture *this_local;
  
  anon_unknown.dwarf_6cd17b::LoadCELLump
            ((this->super_FTexture).SourceLump,(CELPalette *)(palette + 0xf8),&this->m_pixels);
  for (color = (BYTE *)0x0; color < (BYTE *)0xff; color = color + 1) {
    lVar3 = (long)color * 3;
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)celPalette[lVar3 + -8],
                                (uint)celPalette[lVar3 + -7],(uint)celPalette[lVar3 + -6]);
    *(BYTE *)((long)&i + (long)color) = BVar1;
  }
  palette[0xf7] = '\0';
  src = this->m_pixels;
  pBVar2 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->m_pixels = pBVar2;
  FTexture::FlipNonSquareBlockRemap
            (this->m_pixels,src,(uint)(this->super_FTexture).Width,
             (uint)(this->super_FTexture).Height,(uint)(this->super_FTexture).Width,(BYTE *)&i);
  if (src != (BYTE *)0x0) {
    operator_delete__(src);
  }
  return;
}

Assistant:

void FCELTexture::MakeTexture()
{
	CELPalette celPalette;

	LoadCELLump(SourceLump, celPalette, m_pixels);

	BYTE palette[256];

	for (size_t i = 0; i < 255; ++i)
	{
		const BYTE* const color = &celPalette[3 * i];
		palette[i] = ColorMatcher.Pick(color[0], color[1], color[2]);
	}

	// The last palette entry is an alpha mask
	palette[255] = 0;

	const BYTE* const oldPixels = m_pixels;

	m_pixels = new BYTE[Width * Height];
	FlipNonSquareBlockRemap(m_pixels, oldPixels, Width, Height, Width, palette);

	delete[] oldPixels;
}